

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int st__delete_int(st__table *table,long *keyp,char **value)

{
  char *pcVar1;
  st__hash_func_type p_Var2;
  st__table_entry *__ptr;
  st__compare_func_type p_Var3;
  st__table_entry **ppsVar4;
  int iVar5;
  int iVar6;
  st__table_entry **ppsVar7;
  
  pcVar1 = (char *)*keyp;
  p_Var2 = table->hash;
  if (p_Var2 == st__ptrhash) {
    iVar5 = (int)(((ulong)pcVar1 >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var2 == st__numhash) {
    iVar6 = (int)pcVar1;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    iVar5 = iVar5 % table->num_bins;
  }
  else {
    iVar5 = (*p_Var2)(pcVar1,table->num_bins);
  }
  ppsVar7 = table->bins + iVar5;
  do {
    __ptr = *ppsVar7;
    if (__ptr == (st__table_entry *)0x0) {
      return 0;
    }
    p_Var3 = table->compare;
    if (p_Var3 == st__numcmp || p_Var3 == st__ptrcmp) {
      if (__ptr->key == pcVar1) {
LAB_003da237:
        if (table->reorder_flag != 0) {
          *ppsVar7 = __ptr->next;
          ppsVar4 = table->bins;
          __ptr->next = ppsVar4[iVar5];
          ppsVar4[iVar5] = __ptr;
        }
        *ppsVar7 = __ptr->next;
        if (value != (char **)0x0) {
          *value = __ptr->record;
        }
        *keyp = (long)__ptr->key;
        free(__ptr);
        table->num_entries = table->num_entries + -1;
        return 1;
      }
    }
    else {
      iVar6 = (*p_Var3)(pcVar1,__ptr->key);
      if (iVar6 == 0) goto LAB_003da237;
    }
    ppsVar7 = &__ptr->next;
  } while( true );
}

Assistant:

int
 st__delete_int( st__table *table, long *keyp, char **value)
{
    int hash_val;
    char *key = (char *) *keyp;
    st__table_entry *ptr, **last;

    hash_val = do_hash(key, table);

    FIND_ENTRY(table, hash_val, key, ptr ,last);

    if (ptr == NULL) {
        return 0;
    }

    *last = ptr->next;
    if (value != NULL) *value = ptr->record;
    *keyp = (long) ptr->key;
    ABC_FREE(ptr);
    table->num_entries--;
    return 1;
}